

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_add(lyd_node *node,lyd_diff_op op,char *orig_default,char *orig_value,char *key,
                   char *value,char *position,char *orig_key,char *orig_position,lyd_node **diff)

{
  LY_ERR LVar1;
  lyd_node *plVar2;
  char *val_str;
  bool bVar3;
  ly_ctx *local_e0;
  LY_ERR ret___13;
  LY_ERR ret___12;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  lyd_node *LYD_TREE_DFS_next;
  ly_bool LYD_TREE_DFS_continue;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  uint32_t diff_opts;
  lyd_meta *meta;
  lyd_node *plStack_70;
  lyd_diff_op cur_op;
  lyd_node *parent;
  lyd_node *elem;
  lyd_node *diff_parent;
  lyd_node *match;
  lyd_node *siblings;
  lyd_node *dup;
  char *value_local;
  char *key_local;
  char *orig_value_local;
  char *orig_default_local;
  lyd_node *plStack_18;
  lyd_diff_op op_local;
  lyd_node *node_local;
  
  diff_parent = (lyd_node *)0x0;
  elem = (lyd_node *)0x0;
  plStack_70 = (lyd_node *)0x0;
  dup = (lyd_node *)value;
  value_local = key;
  key_local = orig_value;
  orig_value_local = orig_default;
  orig_default_local._4_4_ = op;
  plStack_18 = node;
  if (diff == (lyd_node **)0x0) {
    __assert_fail("diff",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x141,
                  "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                 );
  }
  if (((node->schema->nodetype == 4) && (op == LYD_DIFF_OP_REPLACE)) &&
     ((orig_default == (char *)0x0 || (orig_value == (char *)0x0)))) {
    __assert_fail("(node->schema->nodetype != LYS_LEAF) || (op != LYD_DIFF_OP_REPLACE) || (orig_default && orig_value)"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x144,
                  "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                 );
  }
  if (((((node->schema->nodetype == 0x10) && ((node->schema->flags & 0x40) != 0)) &&
       (op == LYD_DIFF_OP_CREATE)) &&
      (((node->schema == (lysc_node *)0x0 ||
        (((node->schema->nodetype != 0x10 || ((node->schema->flags & 0x200) == 0)) &&
         ((node->schema->nodetype != 8 || ((node->schema->flags & 1) != 0)))))) ||
       (position == (char *)0x0)))) && (key == (char *)0x0)) {
    __assert_fail("(node->schema->nodetype != LYS_LIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_CREATE) || (lysc_is_dup_inst_list(node->schema) && position) || key"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x148,
                  "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                 );
  }
  if (((((node->schema->nodetype == 8) && ((node->schema->flags & 0x40) != 0)) &&
       (op == LYD_DIFF_OP_CREATE)) &&
      ((node->schema == (lysc_node *)0x0 ||
       ((((node->schema->nodetype != 0x10 || ((node->schema->flags & 0x200) == 0)) &&
         ((node->schema->nodetype != 8 || ((node->schema->flags & 1) != 0)))) ||
        (position == (char *)0x0)))))) && (value == (char *)0x0)) {
    __assert_fail("(node->schema->nodetype != LYS_LEAFLIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_CREATE) || (lysc_is_dup_inst_list(node->schema) && position) || value"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x14a,
                  "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                 );
  }
  if (((((node->schema->nodetype == 0x10) && ((node->schema->flags & 0x40) != 0)) &&
       (op == LYD_DIFF_OP_REPLACE)) &&
      ((node->schema == (lysc_node *)0x0 ||
       ((((node->schema->nodetype != 0x10 || ((node->schema->flags & 0x200) == 0)) &&
         ((node->schema->nodetype != 8 || ((node->schema->flags & 1) != 0)))) ||
        ((position == (char *)0x0 || (orig_position == (char *)0x0)))))))) &&
     ((key == (char *)0x0 || (orig_key == (char *)0x0)))) {
    __assert_fail("(node->schema->nodetype != LYS_LIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_REPLACE) || (lysc_is_dup_inst_list(node->schema) && position && orig_position) || (key && orig_key)"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x14e,
                  "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                 );
  }
  if (((((node->schema->nodetype == 8) && ((node->schema->flags & 0x40) != 0)) &&
       (op == LYD_DIFF_OP_REPLACE)) &&
      ((node->schema == (lysc_node *)0x0 ||
       ((((node->schema->nodetype != 0x10 || ((node->schema->flags & 0x200) == 0)) &&
         ((node->schema->nodetype != 8 || ((node->schema->flags & 1) != 0)))) ||
        ((position == (char *)0x0 || (orig_position == (char *)0x0)))))))) &&
     ((value == (char *)0x0 || (orig_value == (char *)0x0)))) {
    __assert_fail("(node->schema->nodetype != LYS_LEAFLIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_REPLACE) || (lysc_is_dup_inst_list(node->schema) && position && orig_position) || (value && orig_value)"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x151,
                  "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                 );
  }
  match = *diff;
  do {
    plStack_70 = plStack_18;
    while( true ) {
      bVar3 = false;
      if ((plStack_70->parent != (lyd_node_inner *)0x0) && (bVar3 = true, elem != (lyd_node *)0x0))
      {
        bVar3 = (plStack_70->parent->field_0).node.schema != elem->schema;
      }
      if (!bVar3) break;
      plStack_70 = lyd_parent(plStack_70);
    }
    if ((plStack_70->schema != (lysc_node *)0x0) &&
       (((plStack_70->schema->nodetype == 0x10 && ((plStack_70->schema->flags & 0x200) != 0)) ||
        ((plStack_70->schema->nodetype == 8 && ((plStack_70->schema->flags & 1) == 0)))))) {
      diff_parent = (lyd_node *)0x0;
      break;
    }
    LVar1 = lyd_find_sibling_first(match,plStack_70,&diff_parent);
    if (LVar1 != LY_SUCCESS) break;
    elem = diff_parent;
    match = lyd_child_no_keys(diff_parent);
  } while (plStack_70 != plStack_18);
  if ((diff_parent == (lyd_node *)0x0) || (plStack_70 != plStack_18)) {
    ret___1 = 0x4e;
    if ((orig_default_local._4_4_ != LYD_DIFF_OP_REPLACE) ||
       ((((plStack_18->schema == (lysc_node *)0x0 || ((plStack_18->schema->nodetype & 0x18) == 0))
         || ((plStack_18->schema->flags & 0x40) == 0)) || ((plStack_18->schema->flags & 2) != 0))))
    {
      ret___1 = 0x4f;
    }
    if (elem == (lyd_node *)0x0) {
      LVar1 = lyd_dup_single(plStack_18,(lyd_node_inner *)0x0,ret___1,&siblings);
    }
    else {
      if (elem->schema == (lysc_node *)0x0) {
        local_e0 = (ly_ctx *)elem[2].schema;
      }
      else {
        local_e0 = elem->schema->module->ctx;
      }
      LVar1 = lyd_dup_single_to_ctx(plStack_18,local_e0,(lyd_node_inner *)elem,ret___1,&siblings);
    }
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    plVar2 = siblings;
    if (elem == (lyd_node *)0x0) {
      elem = lyd_parent(siblings);
      while( true ) {
        bVar3 = false;
        if (elem != (lyd_node *)0x0) {
          bVar3 = elem->parent != (lyd_node_inner *)0x0;
        }
        if (!bVar3) break;
        elem = lyd_parent(elem);
      }
    }
    else {
      while( true ) {
        elem = plVar2;
        bVar3 = false;
        if (elem->parent != (lyd_node_inner *)0x0) {
          bVar3 = (elem->parent->field_0).node.schema == plStack_70->schema;
        }
        if (!bVar3) break;
        plVar2 = lyd_parent(elem);
      }
    }
    if (elem == (lyd_node *)0x0) {
      lyd_diff_insert_sibling(*diff,siblings,diff);
    }
    else if (elem->parent == (lyd_node_inner *)0x0) {
      lyd_diff_insert_sibling(*diff,elem,diff);
    }
    if (((elem != (lyd_node *)0x0) && (elem != siblings)) &&
       (LVar1 = lyd_new_meta((ly_ctx *)0x0,elem,(lys_module *)0x0,"yang:operation","none",2,
                             (lyd_meta **)0x0), LVar1 != LY_SUCCESS)) {
      return LVar1;
    }
  }
  else {
    LVar1 = lyd_diff_get_op(elem,(lyd_diff_op *)((long)&meta + 4));
    if ((LVar1 != LY_SUCCESS) || (meta._4_4_ != 3)) {
      __assert_fail("!lyd_diff_get_op(diff_parent, &cur_op) && (cur_op == LYD_DIFF_OP_NONE)",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x170,
                    "LY_ERR lyd_diff_add(const struct lyd_node *, enum lyd_diff_op, const char *, const char *, const char *, const char *, const char *, const char *, const char *, struct lyd_node **)"
                   );
    }
    if (((elem->schema != (lysc_node *)0x0) && ((elem->schema->nodetype & 0x18) != 0)) &&
       ((elem->schema->flags & 0x40) != 0)) {
      parent = elem;
      while( true ) {
        bVar3 = false;
        if (parent->next != (lyd_node *)0x0) {
          bVar3 = parent->next->schema == parent->schema;
        }
        if (!bVar3) break;
        parent = parent->next;
      }
      if ((parent != elem) && (LVar1 = lyd_insert_after(parent,elem), LVar1 != LY_SUCCESS)) {
        return LVar1;
      }
    }
    lyd_diff_del_meta(elem,"operation");
    for (parent = lyd_child_no_keys(elem); parent != (lyd_node *)0x0; parent = parent->next) {
      lyd_diff_find_meta(parent,"operation",(lyd_meta **)&ret__,(lyd_attr **)0x0);
      if ((_ret__ == (lyd_meta *)0x0) &&
         (LVar1 = lyd_new_meta((ly_ctx *)0x0,parent,(lys_module *)0x0,"yang:operation","none",2,
                               (lyd_meta **)0x0), LVar1 != LY_SUCCESS)) {
        return LVar1;
      }
    }
    siblings = elem;
  }
  plVar2 = siblings;
  val_str = lyd_diff_op2str(orig_default_local._4_4_);
  node_local._4_4_ =
       lyd_new_meta((ly_ctx *)0x0,plVar2,(lys_module *)0x0,"yang:operation",val_str,2,
                    (lyd_meta **)0x0);
  if (node_local._4_4_ == LY_SUCCESS) {
    if (orig_default_local._4_4_ == LYD_DIFF_OP_CREATE) {
      parent = siblings;
      while (parent != (lyd_node *)0x0) {
        if ((((parent != siblings) && (parent->schema != (lysc_node *)0x0)) &&
            ((parent->schema->nodetype & 0x18) != 0)) &&
           (((parent->schema->flags & 0x40) != 0 &&
            (LVar1 = lyd_diff_add_create_nested_userord(parent), LVar1 != LY_SUCCESS)))) {
          return LVar1;
        }
        _ret___7 = lyd_child(parent);
        if (_ret___7 == (lyd_node *)0x0) {
          if (parent == siblings) break;
          _ret___7 = parent->next;
        }
        while ((_ret___7 == (lyd_node *)0x0 &&
               (parent = (lyd_node *)parent->parent,
               (((lyd_node_inner *)parent)->field_0).node.parent != siblings->parent))) {
          _ret___7 = (((lyd_node_inner *)parent)->field_0).node.next;
        }
        parent = _ret___7;
      }
    }
    if (((((orig_value_local == (char *)0x0) ||
          (node_local._4_4_ =
                lyd_new_meta((ly_ctx *)0x0,siblings,(lys_module *)0x0,"yang:orig-default",
                             orig_value_local,2,(lyd_meta **)0x0), node_local._4_4_ == LY_SUCCESS))
         && ((key_local == (char *)0x0 ||
             (node_local._4_4_ =
                   lyd_new_meta((ly_ctx *)0x0,siblings,(lys_module *)0x0,"yang:orig-value",key_local
                                ,2,(lyd_meta **)0x0), node_local._4_4_ == LY_SUCCESS)))) &&
        ((value_local == (char *)0x0 ||
         (node_local._4_4_ =
               lyd_new_meta((ly_ctx *)0x0,siblings,(lys_module *)0x0,"yang:key",value_local,2,
                            (lyd_meta **)0x0), node_local._4_4_ == LY_SUCCESS)))) &&
       (((dup == (lyd_node *)0x0 ||
         (node_local._4_4_ =
               lyd_new_meta((ly_ctx *)0x0,siblings,(lys_module *)0x0,"yang:value",(char *)dup,2,
                            (lyd_meta **)0x0), node_local._4_4_ == LY_SUCCESS)) &&
        ((((position == (char *)0x0 ||
           (node_local._4_4_ =
                 lyd_new_meta((ly_ctx *)0x0,siblings,(lys_module *)0x0,"yang:position",position,2,
                              (lyd_meta **)0x0), node_local._4_4_ == LY_SUCCESS)) &&
          ((orig_key == (char *)0x0 ||
           (node_local._4_4_ =
                 lyd_new_meta((ly_ctx *)0x0,siblings,(lys_module *)0x0,"yang:orig-key",orig_key,2,
                              (lyd_meta **)0x0), node_local._4_4_ == LY_SUCCESS)))) &&
         ((orig_position == (char *)0x0 ||
          (node_local._4_4_ =
                lyd_new_meta((ly_ctx *)0x0,siblings,(lys_module *)0x0,"yang:orig-position",
                             orig_position,2,(lyd_meta **)0x0), node_local._4_4_ == LY_SUCCESS))))))
       )) {
      node_local._4_4_ = LY_SUCCESS;
    }
  }
  return node_local._4_4_;
}

Assistant:

LY_ERR
lyd_diff_add(const struct lyd_node *node, enum lyd_diff_op op, const char *orig_default, const char *orig_value,
        const char *key, const char *value, const char *position, const char *orig_key, const char *orig_position,
        struct lyd_node **diff)
{
    struct lyd_node *dup, *siblings, *match = NULL, *diff_parent = NULL, *elem;
    const struct lyd_node *parent = NULL;
    enum lyd_diff_op cur_op;
    struct lyd_meta *meta;
    uint32_t diff_opts;

    assert(diff);

    /* replace leaf always needs orig-default and orig-value */
    assert((node->schema->nodetype != LYS_LEAF) || (op != LYD_DIFF_OP_REPLACE) || (orig_default && orig_value));

    /* create on userord needs key/value */
    assert((node->schema->nodetype != LYS_LIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_CREATE) ||
            (lysc_is_dup_inst_list(node->schema) && position) || key);
    assert((node->schema->nodetype != LYS_LEAFLIST) || !(node->schema->flags & LYS_ORDBY_USER) ||
            (op != LYD_DIFF_OP_CREATE) || (lysc_is_dup_inst_list(node->schema) && position) || value);

    /* move on userord needs both key and orig-key/value and orig-value */
    assert((node->schema->nodetype != LYS_LIST) || !(node->schema->flags & LYS_ORDBY_USER) || (op != LYD_DIFF_OP_REPLACE) ||
            (lysc_is_dup_inst_list(node->schema) && position && orig_position) || (key && orig_key));
    assert((node->schema->nodetype != LYS_LEAFLIST) || !(node->schema->flags & LYS_ORDBY_USER) ||
            (op != LYD_DIFF_OP_REPLACE) || (lysc_is_dup_inst_list(node->schema) && position && orig_position) ||
            (value && orig_value));

    /* find the first existing parent */
    siblings = *diff;
    do {
        /* find next node parent */
        parent = node;
        while (parent->parent && (!diff_parent || (parent->parent->schema != diff_parent->schema))) {
            parent = lyd_parent(parent);
        }

        if (lysc_is_dup_inst_list(parent->schema)) {
            /* assume it never exists, we are not able to distinguish whether it does or not */
            match = NULL;
            break;
        }

        /* check whether it exists in the diff */
        if (lyd_find_sibling_first(siblings, parent, &match)) {
            break;
        }

        /* another parent found */
        diff_parent = match;

        /* move down in the diff */
        siblings = lyd_child_no_keys(match);
    } while (parent != node);

    if (match && (parent == node)) {
        /* special case when there is already an operation on our descendant */
        assert(!lyd_diff_get_op(diff_parent, &cur_op) && (cur_op == LYD_DIFF_OP_NONE));
        (void)cur_op;

        /* move it to the end where it is expected (matters for user-ordered lists) */
        if (lysc_is_userordered(diff_parent->schema)) {
            for (elem = diff_parent; elem->next && (elem->next->schema == elem->schema); elem = elem->next) {}
            if (elem != diff_parent) {
                LY_CHECK_RET(lyd_insert_after(elem, diff_parent));
            }
        }

        /* will be replaced by the new operation but keep the current op for descendants */
        lyd_diff_del_meta(diff_parent, "operation");
        LY_LIST_FOR(lyd_child_no_keys(diff_parent), elem) {
            lyd_diff_find_meta(elem, "operation", &meta, NULL);
            if (meta) {
                /* explicit operation, fine */
                continue;
            }

            /* set the none operation */
            LY_CHECK_RET(lyd_new_meta(NULL, elem, NULL, "yang:operation", "none", LYD_NEW_VAL_STORE_ONLY, NULL));
        }

        dup = diff_parent;
    } else {
        diff_opts = LYD_DUP_NO_META | LYD_DUP_WITH_PARENTS | LYD_DUP_WITH_FLAGS | LYD_DUP_NO_LYDS;
        if ((op != LYD_DIFF_OP_REPLACE) || !lysc_is_userordered(node->schema) || (node->schema->flags & LYS_CONFIG_R)) {
            /* move applies only to the user-ordered list, no descendants */
            diff_opts |= LYD_DUP_RECURSIVE;
        }

        /* duplicate the subtree (and connect to the diff if possible) */
        if (diff_parent) {
            LY_CHECK_RET(lyd_dup_single_to_ctx(node, LYD_CTX(diff_parent), (struct lyd_node_inner *)diff_parent,
                    diff_opts, &dup));
        } else {
            LY_CHECK_RET(lyd_dup_single(node, NULL, diff_opts, &dup));
        }

        /* find the first duplicated parent */
        if (!diff_parent) {
            diff_parent = lyd_parent(dup);
            while (diff_parent && diff_parent->parent) {
                diff_parent = lyd_parent(diff_parent);
            }
        } else {
            diff_parent = dup;
            while (diff_parent->parent && (diff_parent->parent->schema == parent->schema)) {
                diff_parent = lyd_parent(diff_parent);
            }
        }

        /* no parent existed, must be manually connected */
        if (!diff_parent) {
            /* there actually was no parent to duplicate */
            lyd_diff_insert_sibling(*diff, dup, diff);
        } else if (!diff_parent->parent) {
            lyd_diff_insert_sibling(*diff, diff_parent, diff);
        }

        /* add parent operation, if any */
        if (diff_parent && (diff_parent != dup)) {
            LY_CHECK_RET(lyd_new_meta(NULL, diff_parent, NULL, "yang:operation", "none", LYD_NEW_VAL_STORE_ONLY, NULL));
        }
    }

    /* add subtree operation */
    LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:operation", lyd_diff_op2str(op), LYD_NEW_VAL_STORE_ONLY, NULL));

    if (op == LYD_DIFF_OP_CREATE) {
        /* all nested user-ordered (leaf-)lists need special metadata for create op */
        LYD_TREE_DFS_BEGIN(dup, elem) {
            if ((elem != dup) && lysc_is_userordered(elem->schema)) {
                LY_CHECK_RET(lyd_diff_add_create_nested_userord(elem));
            }
            LYD_TREE_DFS_END(dup, elem);
        }
    }

    /* orig-default */
    if (orig_default) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:orig-default", orig_default, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* orig-value */
    if (orig_value) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:orig-value", orig_value, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* key */
    if (key) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:key", key, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* value */
    if (value) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:value", value, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* position */
    if (position) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:position", position, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* orig-key */
    if (orig_key) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:orig-key", orig_key, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    /* orig-position */
    if (orig_position) {
        LY_CHECK_RET(lyd_new_meta(NULL, dup, NULL, "yang:orig-position", orig_position, LYD_NEW_VAL_STORE_ONLY, NULL));
    }

    return LY_SUCCESS;
}